

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O0

int mbedtls_asn1_get_sequence_of(uchar **p,uchar *end,mbedtls_asn1_sequence *cur,int tag)

{
  mbedtls_asn1_sequence *pmVar1;
  mbedtls_asn1_buf *buf;
  size_t len;
  int ret;
  int tag_local;
  mbedtls_asn1_sequence *cur_local;
  uchar *end_local;
  uchar **p_local;
  
  len._4_4_ = tag;
  _ret = cur;
  cur_local = (mbedtls_asn1_sequence *)end;
  end_local = (uchar *)p;
  p_local._4_4_ = mbedtls_asn1_get_tag(p,end,(size_t *)&buf,0x30);
  if (p_local._4_4_ == 0) {
    if ((mbedtls_asn1_sequence *)((long)&buf->tag + *(long *)end_local) == cur_local) {
      len._0_4_ = 0;
      while (pmVar1 = _ret, *(mbedtls_asn1_sequence **)end_local < cur_local) {
        (_ret->buf).tag = (uint)**(byte **)end_local;
        len._0_4_ = mbedtls_asn1_get_tag
                              ((uchar **)end_local,(uchar *)cur_local,&(_ret->buf).len,len._4_4_);
        if ((int)len != 0) {
          return (int)len;
        }
        (pmVar1->buf).p = *(uchar **)end_local;
        *(size_t *)end_local = (pmVar1->buf).len + *(long *)end_local;
        if (*(mbedtls_asn1_sequence **)end_local < cur_local) {
          pmVar1 = (mbedtls_asn1_sequence *)calloc(1,0x20);
          _ret->next = pmVar1;
          if (_ret->next == (mbedtls_asn1_sequence *)0x0) {
            return -0x6a;
          }
          _ret = _ret->next;
        }
      }
      _ret->next = (mbedtls_asn1_sequence *)0x0;
      if (*(mbedtls_asn1_sequence **)end_local == cur_local) {
        p_local._4_4_ = 0;
      }
      else {
        p_local._4_4_ = -0x66;
      }
    }
    else {
      p_local._4_4_ = -0x66;
    }
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_asn1_get_sequence_of( unsigned char **p,
                          const unsigned char *end,
                          mbedtls_asn1_sequence *cur,
                          int tag)
{
    int ret;
    size_t len;
    mbedtls_asn1_buf *buf;

    /* Get main sequence tag */
    if( ( ret = mbedtls_asn1_get_tag( p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
        return( ret );

    if( *p + len != end )
        return( MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    while( *p < end )
    {
        buf = &(cur->buf);
        buf->tag = **p;

        if( ( ret = mbedtls_asn1_get_tag( p, end, &buf->len, tag ) ) != 0 )
            return( ret );

        buf->p = *p;
        *p += buf->len;

        /* Allocate and assign next pointer */
        if( *p < end )
        {
            cur->next = (mbedtls_asn1_sequence*)mbedtls_calloc( 1,
                                            sizeof( mbedtls_asn1_sequence ) );

            if( cur->next == NULL )
                return( MBEDTLS_ERR_ASN1_ALLOC_FAILED );

            cur = cur->next;
        }
    }

    /* Set final sequence entry's next pointer to NULL */
    cur->next = NULL;

    if( *p != end )
        return( MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    return( 0 );
}